

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O1

void __thiscall irr::gui::IGUIElement::move(IGUIElement *this,vector2d<int> absoluteMovement)

{
  vector2d<int> vVar1;
  vector2d<int> vVar2;
  rect<int> local_18;
  
  vVar1 = (this->DesiredRect).UpperLeftCorner;
  vVar2 = (this->DesiredRect).LowerRightCorner;
  local_18.UpperLeftCorner.Y =
       (int)(((ulong)absoluteMovement & 0xffffffff00000000) + (long)vVar1 >> 0x20);
  local_18.LowerRightCorner.X = (int)((long)absoluteMovement + (long)vVar2);
  local_18.UpperLeftCorner.X = (int)((long)absoluteMovement + (long)vVar1);
  local_18.LowerRightCorner.Y =
       (int)(((ulong)absoluteMovement & 0xffffffff00000000) + (long)vVar2 >> 0x20);
  setRelativePosition(this,&local_18);
  return;
}

Assistant:

virtual void move(core::position2d<s32> absoluteMovement)
	{
		setRelativePosition(DesiredRect + absoluteMovement);
	}